

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

void __thiscall
cmCTestCoverageHandler::WriteXMLLabels(cmCTestCoverageHandler *this,cmXMLWriter *xml,string *source)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  allocator<char> local_51;
  string local_50;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
          ::find(&(this->SourceLabels)._M_t,source);
  if (((_Rb_tree_header *)iVar1._M_node != &(this->SourceLabels)._M_t._M_impl.super__Rb_tree_header)
     && (iVar1._M_node[3]._M_parent != (_Base_ptr)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Labels",&local_51);
    cmXMLWriter::StartElement(xml,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    for (p_Var2 = iVar1._M_node[2]._M_right; p_Var2 != (_Base_ptr)&iVar1._M_node[2]._M_parent;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Label",&local_51);
      cmXMLWriter::Element<std::__cxx11::string>
                (xml,&local_50,
                 (this->Labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (int)p_Var2[1]._M_color);
      std::__cxx11::string::~string((string *)&local_50);
    }
    cmXMLWriter::EndElement(xml);
  }
  return;
}

Assistant:

void cmCTestCoverageHandler::WriteXMLLabels(cmXMLWriter& xml,
                                            std::string const& source)
{
  auto li = this->SourceLabels.find(source);
  if (li != this->SourceLabels.end() && !li->second.empty()) {
    xml.StartElement("Labels");
    for (auto const& ls : li->second) {
      xml.Element("Label", this->Labels[ls]);
    }
    xml.EndElement(); // Labels
  }
}